

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetMaxEFailGrowth(void *arkode_mem,realtype etamxf)

{
  double in_XMM0_Qa;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = arkAccessHAdaptMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8,(ARKodeHAdaptMem *)0x114af8a);
  if (local_4 == 0) {
    if ((in_XMM0_Qa <= 0.0) || (1.0 < in_XMM0_Qa)) {
      *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x10) = 0x3fd3333333333333;
    }
    else {
      *(double *)((long)in_stack_ffffffffffffffd8 + 0x10) = in_XMM0_Qa;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetMaxEFailGrowth(void *arkode_mem, realtype etamxf)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetMaxEFailGrowth",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* if argument legal set it, otherwise set default */
  if ((etamxf <= ZERO) || (etamxf > ONE)) {
    hadapt_mem->etamxf = ETAMXF;
  } else {
    hadapt_mem->etamxf = etamxf;
  }

  return(ARK_SUCCESS);
}